

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::ShaderCompile::ShaderCompile
          (ShaderCompile *this,SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *shader,bool useSync,
          bool serverSync)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_28;
  
  Operation::Operation(&this->super_Operation,"ShaderCompile",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__ShaderCompile_01e085b8;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr(&this->m_shader,shader);
  local_28.m_ptr = &((this->m_shader).m_ptr)->super_Object;
  ((Shader *)local_28.m_ptr)->compiled = true;
  local_28.m_state = (this->m_shader).m_state;
  if (local_28.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_28.m_state)->strongRefCount = (local_28.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_28.m_state)->weakRefCount = (local_28.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_28);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::release(&local_28);
  return;
}

Assistant:

ShaderCompile::ShaderCompile (SharedPtr<Shader> shader, bool useSync, bool serverSync)
	: Operation	("ShaderCompile", useSync, serverSync)
	, m_shader	(shader)
{
	m_shader->compiled = true;
	modifyGLObject(SharedPtr<Object>(m_shader));
}